

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

size_t shuff_compress(uint8_t *out_u8,size_t out_size_u8,uint32_t *input_u32,size_t input_size)

{
  uint64_t *freq;
  uint64_t *syms_00;
  uint64_t i;
  size_t sVar1;
  uint64_t in_RCX;
  bit_io_t *in_RDX;
  uint8_t *in_RDI;
  uint64_t *syms;
  uint64_t *freqs;
  uint64_t temp;
  uint64_t max_symbol;
  uint64_t n;
  uint32_t *up;
  bit_io_t bio;
  uint64_t in_stack_00000198;
  uint64_t *in_stack_000001a0;
  uint64_t *in_stack_000001a8;
  bit_io_t *in_stack_000001b0;
  size_t in_stack_ffffffffffffff90;
  uint64_t *in_stack_ffffffffffffff98;
  uint64_t *mapping;
  bit_io_t *pbVar2;
  bit_io_t local_48;
  uint64_t local_20;
  bit_io_t *local_18;
  uint8_t *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  bit_io_t::bit_io_t(&local_48);
  SHUFF_START_OUTPUT(&local_48,local_8);
  freq = (uint64_t *)shuff_allocate(in_stack_ffffffffffffff90);
  syms_00 = (uint64_t *)shuff_allocate((size_t)freq);
  mapping = (uint64_t *)0x0;
  pbVar2 = local_18;
  while( true ) {
    if ((bit_io_t *)((long)&local_18->bytes_written + local_20 * 4) <= pbVar2) {
      i = shuff_one_pass_freq_count((uint32_t *)local_18,local_20,freq,syms_00,(uint64_t)mapping);
      shuff_build_codes(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0,in_stack_00000198);
      for (pbVar2 = local_18; pbVar2 < (bit_io_t *)((long)&local_18->bytes_written + local_20 * 4);
          pbVar2 = (bit_io_t *)((long)&pbVar2->bytes_written + 4)) {
        shuff_output(pbVar2,i,mapping,in_stack_ffffffffffffff98);
      }
      free(freq);
      free(syms_00);
      sVar1 = SHUFF_FINISH_OUTPUT(&local_48);
      return sVar1;
    }
    if (mapping < (uint64_t *)(ulong)((int)pbVar2->bytes_written + 1)) {
      mapping = (uint64_t *)(ulong)((int)pbVar2->bytes_written + 1);
    }
    if (0x8000000 < (int)pbVar2->bytes_written + 1U) break;
    pbVar2 = (bit_io_t *)((long)&pbVar2->bytes_written + 4);
  }
  fprintf(_stderr,"Symbol %u is out of range.\n",(ulong)((int)pbVar2->bytes_written + 1));
  exit(-1);
}

Assistant:

inline size_t shuff_compress(uint8_t* out_u8, size_t out_size_u8,
    const uint32_t* input_u32, size_t input_size)
{
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    bit_io_t bio;
    SHUFF_START_OUTPUT(&bio, out_u8);

    const uint32_t* up;
    uint64_t n;
    uint64_t max_symbol, temp;

    uint64_t* freqs
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL + 2);
    uint64_t* syms
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL + 2);

    /* find max_symbol and check range*/
    max_symbol = 0;
    for (up = input_u32; up < input_u32 + input_size; up++) {
        if (*up + 1 > max_symbol)
            max_symbol = *up + 1;
        SHUFF_CHECK_SYMBOL_RANGE(*up + 1);
    }

    n = shuff_one_pass_freq_count(
        input_u32, input_size, freqs, syms, max_symbol);

    shuff_build_codes(&bio, syms, freqs, n);

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = SHUFF_BYTES_WRITTEN(&bio);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    for (up = input_u32; up < input_u32 + input_size; up++)
        shuff_output(&bio, *up + 1, syms, freqs);

    free(freqs);
    free(syms);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes
        = SHUFF_BYTES_WRITTEN(&bio) - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return SHUFF_FINISH_OUTPUT(&bio);
}